

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

int util::compareChar(char *str1,char *str2)

{
  size_t sVar1;
  size_t sVar2;
  uint in_ECX;
  size_t sVar3;
  ulong uVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  
  sVar1 = strlen(str1);
  sVar2 = strlen(str2);
  sVar3 = sVar1;
  if (sVar2 < sVar1) {
    sVar3 = sVar2;
  }
  bVar7 = sVar3 != 0;
  if (bVar7) {
    cVar5 = *str1;
    cVar6 = *str2;
    in_ECX = 0xffffffff;
    if (cVar6 <= cVar5) {
      uVar4 = 1;
      do {
        if (cVar6 < cVar5) {
          in_ECX = 1;
          break;
        }
        bVar7 = uVar4 < sVar3;
        if (sVar3 == uVar4) break;
        cVar5 = str1[uVar4];
        cVar6 = str2[uVar4];
        uVar4 = uVar4 + 1;
      } while (cVar6 <= cVar5);
    }
  }
  if (!bVar7) {
    in_ECX = 0xffffffff;
    if (sVar2 <= sVar1) {
      in_ECX = (uint)(sVar2 != sVar1);
    }
  }
  return in_ECX;
}

Assistant:

int util::compareChar(const char* str1, const char* str2){

    for(int i = 0 ; i < min(strlen(str1), strlen(str2)); i++){
        if(str1[i] < str2[i])
            return -1;
        else if (str1[i] > str2[i])
            return 1;
    }
    if(strlen(str2) > strlen(str1))
        return -1;
    else if(strlen(str2) == strlen(str1))
        return 0;
    return 1;
}